

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O3

bool __thiscall
psy::C::Parser::parseExtGNU_ChooseExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  ParseOptions *this_00;
  LanguageExtensions *this_01;
  ExtGNU_ChooseExpressionSyntax *pEVar3;
  IndexType IVar4;
  ostream *poVar5;
  size_type __dnew;
  string local_50;
  size_type local_30;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == Keyword_ExtGNU___builtin_choose_expr) {
    this_00 = SyntaxTree::parseOptions(this->tree_);
    this_01 = ParseOptions::languageExtensions(this_00);
    bVar1 = LanguageExtensions::isEnabled_extGNU_InternalBuiltins(this_01);
    if (!bVar1) {
      local_30 = 0x15;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_30);
      local_50.field_2._M_allocated_capacity = local_30;
      builtin_strncpy(local_50._M_dataplus._M_p,"GNU internal builtins",0x15);
      local_50._M_string_length = local_30;
      local_50._M_dataplus._M_p[local_30] = '\0';
      DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    pEVar3 = makeNode<psy::C::ExtGNU_ChooseExpressionSyntax>(this);
    *expr = &pEVar3->super_ExpressionSyntax;
    IVar4 = consume(this);
    pEVar3->kwTkIdx_ = IVar4;
    bVar1 = match(this,OpenParenToken,&pEVar3->openParenTkIdx_);
    if (((bVar1) &&
        (bVar1 = parseConstant<psy::C::ConstantExpressionSyntax>
                           (this,&pEVar3->constExpr_,IntegerConstantExpression), bVar1)) &&
       (bVar1 = match(this,CommaToken,&pEVar3->commaTkIdx1_), bVar1)) {
      bVar1 = parseExpressionWithPrecedenceCast(this,&pEVar3->expr1_);
      if (((bVar1) && (bVar1 = parseNAryExpression_AtOperator(this,&pEVar3->expr1_,'\x02'), bVar1))
         && ((bVar1 = match(this,CommaToken,&pEVar3->commaTkIdx2_), bVar1 &&
             (bVar1 = parseNAryExpression(this,&pEVar3->expr2_,'\x02'), bVar1)))) {
        bVar1 = match(this,CloseParenToken,&pEVar3->closeParenTkIdx_);
        return bVar1;
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x30b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"assert failure: `__builtin_choose_expr\'",0x27);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool Parser::parseExtGNU_ChooseExpression_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_ExtGNU___builtin_choose_expr,
                  return false,
                  "assert failure: `__builtin_choose_expr'");

    if (!tree_->parseOptions().languageExtensions().isEnabled_extGNU_InternalBuiltins())
        diagReporter_.ExpectedFeature("GNU internal builtins");

    auto chooseExpr = makeNode<ExtGNU_ChooseExpressionSyntax>();
    expr = chooseExpr;
    chooseExpr->kwTkIdx_ = consume();
    return match(SyntaxKind::OpenParenToken, &chooseExpr->openParenTkIdx_)
        && parseConstant<ConstantExpressionSyntax>(chooseExpr->constExpr_, SyntaxKind::IntegerConstantExpression)
        && match(SyntaxKind::CommaToken, &chooseExpr->commaTkIdx1_)
        && parseExpressionWithPrecedenceAssignment(chooseExpr->expr1_)
        && match(SyntaxKind::CommaToken, &chooseExpr->commaTkIdx2_)
        && parseExpressionWithPrecedenceAssignment(chooseExpr->expr2_)
        && match(SyntaxKind::CloseParenToken, &chooseExpr->closeParenTkIdx_);
}